

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::leS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  uVar2 = (this->type).id;
  if (6 < uVar2) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  iVar5 = (int)uVar2;
  if (iVar5 == 3) {
    lVar3 = (this->field_0).i64;
    lVar4 = (other->field_0).i64;
    bVar8 = SBORROW8(lVar3,lVar4);
    bVar7 = lVar3 - lVar4 < 0;
    bVar6 = lVar3 == lVar4;
  }
  else {
    if (iVar5 != 2) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x569);
    }
    iVar1 = (this->field_0).i32;
    iVar5 = (other->field_0).i32;
    bVar8 = SBORROW4(iVar1,iVar5);
    bVar7 = iVar1 - iVar5 < 0;
    bVar6 = iVar1 == iVar5;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)(bVar6 || bVar8 != bVar7);
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::leS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 <= other.i32);
    case Type::i64:
      return Literal(i64 <= other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}